

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O0

string * __thiscall
transwarp::to_string_abi_cxx11_(string *__return_storage_ptr__,transwarp *this,task_type *type)

{
  invalid_parameter *this_00;
  allocator local_59;
  string local_58;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  transwarp *local_18;
  task_type *type_local;
  
  local_18 = this;
  type_local = (task_type *)__return_storage_ptr__;
  switch(*(undefined4 *)this) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"root",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"accept",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"accept_any",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"consume",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"consume_any",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"wait",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"wait_any",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
    break;
  default:
    this_00 = (invalid_parameter *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"task type",&local_59);
    invalid_parameter::invalid_parameter(this_00,&local_58);
    __cxa_throw(this_00,&invalid_parameter::typeinfo,invalid_parameter::~invalid_parameter);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(const transwarp::task_type& type) {
    switch (type) {
    case transwarp::task_type::root: return "root";
    case transwarp::task_type::accept: return "accept";
    case transwarp::task_type::accept_any: return "accept_any";
    case transwarp::task_type::consume: return "consume";
    case transwarp::task_type::consume_any: return "consume_any";
    case transwarp::task_type::wait: return "wait";
    case transwarp::task_type::wait_any: return "wait_any";
    default: throw transwarp::invalid_parameter("task type");
    }
}